

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.h
# Opt level: O1

Float __thiscall
pbrt::BVHLightSampler::EvaluateCost(BVHLightSampler *this,LightBounds *b,Bounds3f *bounds,int dim)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  float *__result;
  float *pfVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 local_28;
  float local_20;
  undefined1 extraout_var [60];
  
  fVar8 = acosf(b->cosTheta_o);
  fVar9 = acosf(b->cosTheta_e);
  auVar12 = vminss_avx(SUB6416(ZEXT464(0x40490fdb),0),ZEXT416((uint)(fVar9 + fVar8)));
  fVar9 = auVar12._0_4_;
  auVar12._0_12_ = ZEXT812(0);
  auVar12._12_4_ = 0;
  auVar12 = vmaxss_avx(ZEXT416((uint)(1.0 - b->cosTheta_o * b->cosTheta_o)),auVar12);
  if (auVar12._0_4_ < 0.0) {
    fVar10 = sqrtf(auVar12._0_4_);
  }
  else {
    auVar12 = vsqrtss_avx(auVar12,auVar12);
    fVar10 = auVar12._0_4_;
  }
  fVar1 = b->cosTheta_o;
  auVar12 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar9),ZEXT416((uint)fVar8)
                           );
  auVar11._0_4_ = cosf(auVar12._0_4_);
  auVar11._4_60_ = extraout_var;
  local_20 = (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.z -
             (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
  uVar2 = (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
  uVar4 = (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
  auVar14._4_4_ = uVar4;
  auVar14._0_4_ = uVar2;
  auVar14._8_8_ = 0;
  uVar3 = (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.x;
  uVar5 = (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
  auVar13._4_4_ = uVar5;
  auVar13._0_4_ = uVar3;
  auVar13._8_8_ = 0;
  auVar12 = vsubps_avx(auVar13,auVar14);
  pfVar6 = (float *)&local_28;
  local_28 = vmovlps_avx(auVar12);
  lVar7 = 4;
  do {
    if (*pfVar6 < *(float *)((long)&local_28 + lVar7)) {
      pfVar6 = (float *)((long)&local_28 + lVar7);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  if (dim == 0) {
    local_20 = auVar12._0_4_;
  }
  else if (dim == 1) {
    auVar12 = vmovshdup_avx(auVar12);
    local_20 = auVar12._0_4_;
  }
  auVar12 = vfmsub213ss_fma(ZEXT416((uint)(fVar9 + fVar9)),ZEXT416((uint)fVar10),auVar11._0_16_);
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar10),ZEXT416((uint)(fVar8 * -2.0)));
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)((b->cosTheta_o + auVar12._0_4_) * 1.5707964)),
                            ZEXT416((uint)(1.0 - fVar1)),ZEXT416(0x40c90fdb));
  fVar8 = (b->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x -
          (b->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
  fVar9 = (b->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z -
          (b->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
  auVar13 = ZEXT416((uint)((b->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y -
                          (b->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y));
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar9)),auVar13,ZEXT416((uint)fVar8));
  auVar14 = vfmadd231ss_fma(auVar14,auVar13,ZEXT416((uint)fVar9));
  return (*pfVar6 / local_20) * auVar12._0_4_ * b->phi * (auVar14._0_4_ + auVar14._0_4_);
}

Assistant:

Float EvaluateCost(const LightBounds &b, const Bounds3f &bounds, int dim) const {
        // Evaluate direction bounds measure for _LightBounds_
        Float theta_o = std::acos(b.cosTheta_o), theta_e = std::acos(b.cosTheta_e);
        Float theta_w = std::min(theta_o + theta_e, Pi);
        Float sinTheta_o = SafeSqrt(1 - Sqr(b.cosTheta_o));
        Float Momega = 2 * Pi * (1 - b.cosTheta_o) +
                       Pi / 2 *
                           (2 * theta_w * sinTheta_o - std::cos(theta_o - 2 * theta_w) -
                            2 * theta_o * sinTheta_o + b.cosTheta_o);

        // Return complete cost estimate for _LightBounds_
        Float Kr = MaxComponentValue(bounds.Diagonal()) / bounds.Diagonal()[dim];
        return b.phi * Momega * Kr * b.bounds.SurfaceArea();
    }